

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O3

void cos_maketable(void)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  double dVar4;
  
  if (cos_table == (float *)0x0) {
    pfVar1 = (float *)getbytes(0x804);
    fVar3 = 0.0;
    lVar2 = 0;
    cos_table = pfVar1;
    do {
      dVar4 = cos((double)fVar3);
      pfVar1[lVar2] = (float)dVar4;
      fVar3 = fVar3 + 0.012271836;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 0x201);
  }
  return;
}

Assistant:

static void cos_maketable(void)
{
    int i;
    float *fp, phase, phsinc = (2. * 3.14159) / COSTABSIZE;
    union tabfudge tf;

    if (cos_table) return;
    cos_table = (float *)getbytes(sizeof(float) * (COSTABSIZE+1));
    for (i = COSTABSIZE + 1, fp = cos_table, phase = 0; i--;
        fp++, phase += phsinc)
            *fp = cos(phase);

        /* here we check at startup whether the byte alignment
            is as we declared it.  If not, the code has to be
            recompiled the other way. */
    tf.tf_d = UNITBIT32 + 0.5;
    if ((unsigned)tf.tf_i[LOWOFFSET] != 0x80000000)
        bug("cos~: unexpected machine alignment");
}